

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void temp_load(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet desired_regs,TCGRegSet allocated_regs,
              TCGRegSet preferred_regs)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  TCGReg ret;
  ulong uVar3;
  ulong uVar4;
  uint r;
  uint uVar5;
  int opc;
  ulong uVar6;
  uint uVar7;
  undefined4 in_register_00000084;
  intptr_t offset;
  int in_R9D;
  
  offset = CONCAT44(in_register_00000084,preferred_regs);
  uVar3 = *(ulong *)ts;
  if ((char)(uVar3 >> 8) == '\x01') {
    return;
  }
  uVar6 = uVar3 >> 8 & 0xff;
  uVar5 = (uint)(uVar3 >> 0x20);
  if ((int)uVar6 == 2) {
    ret = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,(_Bool)((byte)(uVar5 >> 2) & 1)
                       );
    tcg_out_ld(s,(uint)(byte)ts->field_0x3,ret,(uint)*(byte *)ts->mem_base,ts->mem_offset);
    uVar3 = *(ulong *)ts | 0x800000000;
LAB_00d0f851:
    *(ulong *)ts = (uVar3 & 0xffffffffffff0000) + (ulong)(byte)ret + 0x100;
    s->reg_to_temp[ret] = ts;
    return;
  }
  if ((int)uVar6 == 3) {
    ret = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,(_Bool)((byte)(uVar5 >> 2) & 1)
                       );
    tcg_out_movi(s,(uint)(byte)ts->field_0x3,ret,ts->val);
    uVar3 = *(ulong *)ts & 0xfffffff7ffffffff;
    goto LAB_00d0f851;
  }
  temp_load_cold_1();
  uVar4 = s->current_frame_offset + 7U & 0xfffffffffffffff8;
  s->current_frame_offset = uVar4;
  uVar3 = uVar4 + 8;
  if ((long)uVar3 <= s->frame_end) {
    *(ulong *)(uVar6 + 0x18) = uVar4;
    *(TCGTemp **)(uVar6 + 0x10) = s->frame_temp;
    *(byte *)(uVar6 + 4) = *(byte *)(uVar6 + 4) | 0x10;
    s->current_frame_offset = s->current_frame_offset + 8;
    return;
  }
  temp_allocate_frame_cold_1();
  if (4 < (uint)uVar6) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x486,(char *)0x0);
  }
  uVar5 = (uint)uVar3;
  switch(uVar6 & 0xffffffff) {
  case 0:
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = uVar3 & 0xffffffff;
    }
    uVar7 = (uint)uVar6;
    if (r < 0x10) {
      uVar7 = (uint)(uVar6 >> 3) & 1 | r >> 1 & 4;
      if (uVar7 != 0) {
        pbVar1 = s->code_ptr;
        s->code_ptr = pbVar1 + 1;
        *pbVar1 = (byte)uVar7 | 0x40;
      }
LAB_00d0f969:
      ptVar2 = s->code_ptr;
      s->code_ptr = ptVar2 + 1;
      *ptVar2 = 0x89;
      goto LAB_00d0f9b8;
    }
    opc = 0x57e;
    break;
  case 1:
    if (r < 0x10) {
      uVar7 = 0;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)(uVar7 >> 3) & 1 | (byte)(r >> 1) & 4 | 0x48;
      goto LAB_00d0f969;
    }
  case 2:
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = uVar5;
    }
    opc = 0x5d6;
    break;
  case 3:
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = uVar5;
    }
    opc = 0x57f;
    break;
  case 4:
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = uVar5;
    }
    opc = 0xa017f;
  }
  tcg_out_vex_opc(s,opc,r,0,uVar7,in_R9D);
LAB_00d0f9b8:
  tcg_out_sib_offset(s,r,uVar5,-1,0,offset);
  return;
}

Assistant:

static void temp_load(TCGContext *s, TCGTemp *ts, TCGRegSet desired_regs,
                      TCGRegSet allocated_regs, TCGRegSet preferred_regs)
{
    TCGReg reg;

    switch (ts->val_type) {
    case TEMP_VAL_REG:
        return;
    case TEMP_VAL_CONST:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_movi(s, ts->type, reg, ts->val);
        ts->mem_coherent = 0;
        break;
    case TEMP_VAL_MEM:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_ld(s, ts->type, reg, ts->mem_base->reg, ts->mem_offset);
        ts->mem_coherent = 1;
        break;
    case TEMP_VAL_DEAD:
    default:
        tcg_abort();
    }
    ts->reg = reg;
    ts->val_type = TEMP_VAL_REG;
    s->reg_to_temp[reg] = ts;
}